

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

RoundLayerParams * __thiscall
CoreML::Specification::RoundLayerParams::New(RoundLayerParams *this,Arena *arena)

{
  RoundLayerParams *this_00;
  
  this_00 = (RoundLayerParams *)operator_new(0x18);
  RoundLayerParams(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::RoundLayerParams>(arena,this_00);
  }
  return this_00;
}

Assistant:

RoundLayerParams* RoundLayerParams::New(::google::protobuf::Arena* arena) const {
  RoundLayerParams* n = new RoundLayerParams;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}